

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

baseHolder * __thiscall
cs_impl::any::holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_>::duplicate
          (holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *this)

{
  holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *phVar1;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_00000008;
  allocator_type<cs_impl::any::holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_00000010;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>,64ul,cs_impl::default_allocator_provider>
           ::alloc<std::deque<cs_impl::any,std::allocator<cs_impl::any>>&>
                     (in_stack_00000010,in_stack_00000008);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}